

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
copy_attr(exr_context_t ctxt,exr_priv_part_t part,exr_attribute_t *srca,int *update_tiles)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  exr_context_t ctxt_00;
  uint8_t **in_RCX;
  exr_attr_float_vector_t *fv;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *in_RDX;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *in_RSI;
  exr_attribute_list_t *in_RDI;
  exr_attribute_t **in_stack_00000010;
  exr_attribute_type_t type;
  exr_attribute_t *attr;
  char *aname;
  exr_result_t rv;
  exr_attr_opaquedata_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int32_t in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar5;
  exr_context_t ctxt_01;
  exr_context_t ctxt_02;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = 0x21;
  ctxt_02 = *(exr_context_t *)in_RDX;
  ctxt_01 = (exr_context_t)0x0;
  uVar5 = *(uint *)(in_RDX + 0x14);
  fv = (exr_attr_float_vector_t *)(ulong)((int)(char)ctxt_02->mode - 99);
  switch(fv) {
  case (exr_attr_float_vector_t *)0x0:
    iVar4 = strcmp((char *)ctxt_02,"channels");
    if (iVar4 == 0) {
      in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x20);
      local_2c = exr_attr_list_add_static_name
                           ((exr_context_t)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                            (int32_t)in_RDX,in_RCX,in_stack_00000010);
      ctxt_01 = *(exr_context_t *)(in_RSI + 0x20);
    }
    else {
      iVar4 = strcmp((char *)ctxt_02,"compression");
      if (iVar4 == 0) {
        in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x28);
        local_2c = exr_attr_list_add_static_name
                             ((exr_context_t)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                              (int32_t)in_RDX,in_RCX,in_stack_00000010);
        ctxt_01 = *(exr_context_t *)(in_RSI + 0x28);
        if (local_2c == 0) {
          *(uint *)(in_RSI + 0xb0) = (uint)(byte)in_RDX[0x18];
        }
      }
      else {
        iVar4 = strcmp((char *)ctxt_02,"chunkCount");
        if (iVar4 == 0) {
          in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x80);
          local_2c = exr_attr_list_add_static_name
                               ((exr_context_t)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                                ,(char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                                (int32_t)in_RDX,in_RCX,in_stack_00000010);
          ctxt_01 = *(exr_context_t *)(in_RSI + 0x80);
        }
      }
    }
    break;
  case (exr_attr_float_vector_t *)0x1:
    iVar4 = strcmp((char *)ctxt_02,"dataWindow");
    if (iVar4 == 0) {
      in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x30);
      local_2c = exr_attr_list_add_static_name
                           ((exr_context_t)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                            (int32_t)in_RDX,in_RCX,in_stack_00000010);
      ctxt_01 = *(exr_context_t *)(in_RSI + 0x30);
      if (local_2c == 0) {
        puVar2 = *(undefined8 **)(in_RDX + 0x18);
        *(undefined8 *)(in_RSI + 0x90) = *puVar2;
        *(undefined8 *)(in_RSI + 0x98) = puVar2[1];
      }
      *(undefined4 *)in_RCX = 1;
    }
    else {
      iVar4 = strcmp((char *)ctxt_02,"displayWindow");
      if (iVar4 == 0) {
        in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x38);
        local_2c = exr_attr_list_add_static_name
                             ((exr_context_t)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                              (int32_t)in_RDX,in_RCX,in_stack_00000010);
        ctxt_01 = *(exr_context_t *)(in_RSI + 0x38);
        if (local_2c == 0) {
          puVar2 = *(undefined8 **)(in_RDX + 0x18);
          *(undefined8 *)(in_RSI + 0xa0) = *puVar2;
          *(undefined8 *)(in_RSI + 0xa8) = puVar2[1];
        }
      }
    }
    break;
  default:
    break;
  case (exr_attr_float_vector_t *)0x9:
    iVar4 = strcmp((char *)ctxt_02,"lineOrder");
    if (iVar4 == 0) {
      in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x40);
      local_2c = exr_attr_list_add_static_name
                           ((exr_context_t)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                            (int32_t)in_RDX,in_RCX,in_stack_00000010);
      ctxt_01 = *(exr_context_t *)(in_RSI + 0x40);
      if (local_2c == 0) {
        *(uint *)(in_RSI + 0xb4) = (uint)(byte)in_RDX[0x18];
      }
    }
    break;
  case (exr_attr_float_vector_t *)0xb:
    iVar4 = strcmp((char *)ctxt_02,"name");
    if (iVar4 == 0) {
      in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x68);
      local_2c = exr_attr_list_add_static_name
                           ((exr_context_t)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                            (int32_t)in_RDX,in_RCX,in_stack_00000010);
      ctxt_01 = *(exr_context_t *)(in_RSI + 0x68);
    }
    break;
  case (exr_attr_float_vector_t *)0xd:
    iVar4 = strcmp((char *)ctxt_02,"pixelAspectRatio");
    if (iVar4 == 0) {
      in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x48);
      local_2c = exr_attr_list_add_static_name
                           ((exr_context_t)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                            (int32_t)in_RDX,in_RCX,in_stack_00000010);
      ctxt_01 = *(exr_context_t *)(in_RSI + 0x48);
    }
    break;
  case (exr_attr_float_vector_t *)0x10:
    iVar4 = strcmp((char *)ctxt_02,"screenWindowCenter");
    if (iVar4 == 0) {
      in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x50);
      local_2c = exr_attr_list_add_static_name
                           ((exr_context_t)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                            (int32_t)in_RDX,in_RCX,in_stack_00000010);
      ctxt_01 = *(exr_context_t *)(in_RSI + 0x50);
    }
    else {
      iVar4 = strcmp((char *)ctxt_02,"screenWindowWidth");
      if (iVar4 == 0) {
        in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x58);
        local_2c = exr_attr_list_add_static_name
                             ((exr_context_t)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                              (int32_t)in_RDX,in_RCX,in_stack_00000010);
        ctxt_01 = *(exr_context_t *)(in_RSI + 0x58);
      }
    }
    break;
  case (exr_attr_float_vector_t *)0x11:
    iVar4 = strcmp((char *)ctxt_02,"tiles");
    if (iVar4 == 0) {
      in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x60);
      local_2c = exr_attr_list_add_static_name
                           ((exr_context_t)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                            (int32_t)in_RDX,in_RCX,in_stack_00000010);
      ctxt_01 = *(exr_context_t *)(in_RSI + 0x60);
      *(undefined4 *)in_RCX = 1;
    }
    else {
      iVar4 = strcmp((char *)ctxt_02,"type");
      if (iVar4 == 0) {
        in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x70);
        local_2c = exr_attr_list_add_static_name
                             ((exr_context_t)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                              (int32_t)in_RDX,in_RCX,in_stack_00000010);
        ctxt_01 = *(exr_context_t *)(in_RSI + 0x70);
      }
    }
    break;
  case (exr_attr_float_vector_t *)0x13:
    iVar4 = strcmp((char *)ctxt_02,"version");
    if (iVar4 == 0) {
      in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)(in_RSI + 0x78);
      local_2c = exr_attr_list_add_static_name
                           ((exr_context_t)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                            (int32_t)in_RDX,in_RCX,in_stack_00000010);
      ctxt_01 = *(exr_context_t *)(in_RSI + 0x78);
    }
  }
  if ((local_2c == 0x21) && (ctxt_01 == (exr_context_t)0x0)) {
    in_stack_ffffffffffffff98 = (exr_attr_opaquedata_t *)&stack0xffffffffffffffc0;
    local_2c = exr_attr_list_add((exr_context_t)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI,(char *)in_RSI,(exr_attribute_type_t)((ulong)in_RDX >> 0x20)
                                 ,(int32_t)in_RDX,in_RCX,in_stack_00000010);
  }
  if (local_2c == 0) {
    ctxt_00 = (exr_context_t)(ulong)uVar5;
    switch(ctxt_00) {
    case (exr_context_t)0x0:
    case (exr_context_t)0x1f:
    default:
      local_2c = (*(code *)in_RDI[2].entries)(in_RDI,0xe);
      break;
    case (exr_context_t)0x1:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      puVar2[1] = puVar3[1];
      break;
    case (exr_context_t)0x2:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      puVar2[1] = puVar3[1];
      break;
    case (exr_context_t)0x3:
      local_2c = exr_attr_chlist_duplicate
                           (ctxt_02,(exr_attr_chlist_t *)ctxt_01,
                            (exr_attr_chlist_t *)CONCAT44(uVar5,in_stack_ffffffffffffffb8));
      break;
    case (exr_context_t)0x4:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      puVar2[1] = puVar3[1];
      puVar2[2] = puVar3[2];
      puVar2[3] = puVar3[3];
      break;
    case (exr_context_t)0x5:
      *(_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)
       &(ctxt_01->tmp_filename).length = in_RDX[0x18];
      break;
    case (exr_context_t)0x6:
      uVar1 = *(undefined8 *)(in_RDX + 0x18);
      (ctxt_01->tmp_filename).length = (int)uVar1;
      (ctxt_01->tmp_filename).alloc_size = (int)((ulong)uVar1 >> 0x20);
      break;
    case (exr_context_t)0x7:
      *(_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)
       &(ctxt_01->tmp_filename).length = in_RDX[0x18];
      break;
    case (exr_context_t)0x8:
      (ctxt_01->tmp_filename).length = *(int32_t *)(in_RDX + 0x18);
      break;
    case (exr_context_t)0x9:
      local_2c = exr_attr_float_vector_create
                           ((exr_context_t)CONCAT44(uVar5,in_stack_ffffffffffffffb8),fv,
                            (float *)ctxt_00,in_stack_ffffffffffffffa4);
      break;
    case (exr_context_t)0xa:
      (ctxt_01->tmp_filename).length = *(int32_t *)(in_RDX + 0x18);
      break;
    case (exr_context_t)0xb:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      puVar2[1] = puVar3[1];
      puVar2[2] = puVar3[2];
      *(undefined4 *)(puVar2 + 3) = *(undefined4 *)(puVar3 + 3);
      break;
    case (exr_context_t)0xc:
      *(_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)
       &(ctxt_01->tmp_filename).length = in_RDX[0x18];
      break;
    case (exr_context_t)0xd:
      memcpy(*(void **)&ctxt_01->tmp_filename,*(void **)(in_RDX + 0x18),0x24);
      break;
    case (exr_context_t)0xe:
      memcpy(*(void **)&ctxt_01->tmp_filename,*(void **)(in_RDX + 0x18),0x48);
      break;
    case (exr_context_t)0xf:
      memcpy(*(void **)&ctxt_01->tmp_filename,*(void **)(in_RDX + 0x18),0x40);
      break;
    case (exr_context_t)0x10:
      memcpy(*(void **)&ctxt_01->tmp_filename,*(void **)(in_RDX + 0x18),0x80);
      break;
    case (exr_context_t)0x11:
      local_2c = exr_attr_preview_create
                           (ctxt_01,(exr_attr_preview_t *)CONCAT44(uVar5,in_stack_ffffffffffffffb8),
                            (uint32_t)((ulong)fv >> 0x20),(uint32_t)fv,(uint8_t *)ctxt_00);
      break;
    case (exr_context_t)0x12:
      **(undefined8 **)&ctxt_01->tmp_filename = **(undefined8 **)(in_RDX + 0x18);
      break;
    case (exr_context_t)0x13:
      local_2c = exr_attr_string_create_with_length
                           ((exr_context_t)CONCAT44(uVar5,in_stack_ffffffffffffffb8),
                            (exr_attr_string_t *)fv,(char *)ctxt_00,in_stack_ffffffffffffffa4);
      break;
    case (exr_context_t)0x14:
      local_2c = exr_attr_string_vector_copy
                           ((exr_context_t)CONCAT44(uVar5,in_stack_ffffffffffffffb8),
                            (exr_attr_string_vector_t *)fv,(exr_attr_string_vector_t *)ctxt_00);
      break;
    case (exr_context_t)0x15:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      *(undefined1 *)(puVar2 + 1) = *(undefined1 *)(puVar3 + 1);
      break;
    case (exr_context_t)0x16:
      **(undefined8 **)&ctxt_01->tmp_filename = **(undefined8 **)(in_RDX + 0x18);
      break;
    case (exr_context_t)0x17:
      **(undefined8 **)&ctxt_01->tmp_filename = **(undefined8 **)(in_RDX + 0x18);
      break;
    case (exr_context_t)0x18:
      **(undefined8 **)&ctxt_01->tmp_filename = **(undefined8 **)(in_RDX + 0x18);
      break;
    case (exr_context_t)0x19:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      puVar2[1] = puVar3[1];
      break;
    case (exr_context_t)0x1a:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      *(undefined4 *)(puVar2 + 1) = *(undefined4 *)(puVar3 + 1);
      break;
    case (exr_context_t)0x1b:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      *(undefined4 *)(puVar2 + 1) = *(undefined4 *)(puVar3 + 1);
      break;
    case (exr_context_t)0x1c:
      puVar2 = *(undefined8 **)&ctxt_01->tmp_filename;
      puVar3 = *(undefined8 **)(in_RDX + 0x18);
      *puVar2 = *puVar3;
      puVar2[1] = puVar3[1];
      puVar2[2] = puVar3[2];
      break;
    case (exr_context_t)0x1e:
      local_2c = exr_attr_opaquedata_copy
                           (ctxt_00,(exr_attr_opaquedata_t *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
    }
    if (local_2c != 0) {
      exr_attr_list_remove
                (ctxt_02,(exr_attribute_list_t *)ctxt_01,
                 (exr_attribute_t *)CONCAT44(uVar5,in_stack_ffffffffffffffb8));
    }
  }
  return local_2c;
}

Assistant:

static exr_result_t
copy_attr (
    exr_context_t          ctxt,
    exr_priv_part_t        part,
    const exr_attribute_t* srca,
    int*                   update_tiles)
{
    exr_result_t         rv    = EXR_ERR_UNKNOWN;
    const char*          aname = srca->name;
    exr_attribute_t*     attr  = NULL;
    exr_attribute_type_t type  = srca->type;
    switch (aname[0])
    {
        case 'c':
            if (0 == strcmp (aname, EXR_REQ_CHANNELS_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_CHANNELS_STR,
                    type,
                    0,
                    NULL,
                    &(part->channels));
                attr = part->channels;
            }
            else if (0 == strcmp (aname, EXR_REQ_COMP_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_COMP_STR,
                    type,
                    0,
                    NULL,
                    &(part->compression));
                attr = part->compression;
                if (rv == EXR_ERR_SUCCESS)
                    part->comp_type = (exr_compression_t) srca->uc;
            }
            else if (0 == strcmp (aname, EXR_REQ_CHUNK_COUNT_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_CHUNK_COUNT_STR,
                    type,
                    0,
                    NULL,
                    &(part->chunkCount));
                attr = part->chunkCount;
            }
            break;
        case 'd':
            if (0 == strcmp (aname, EXR_REQ_DATA_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_DATA_STR,
                    type,
                    0,
                    NULL,
                    &(part->dataWindow));
                attr = part->dataWindow;
                if (rv == EXR_ERR_SUCCESS) part->data_window = *(srca->box2i);
                *update_tiles = 1;
            }
            else if (0 == strcmp (aname, EXR_REQ_DISP_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_DISP_STR,
                    type,
                    0,
                    NULL,
                    &(part->displayWindow));
                attr = part->displayWindow;
                if (rv == EXR_ERR_SUCCESS)
                    part->display_window = *(srca->box2i);
            }
            break;
        case 'l':
            if (0 == strcmp (aname, EXR_REQ_LO_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_LO_STR,
                    type,
                    0,
                    NULL,
                    &(part->lineOrder));
                attr = part->lineOrder;
                if (rv == EXR_ERR_SUCCESS)
                    part->lineorder = (exr_lineorder_t) srca->uc;
            }
            break;
        case 'n':
            if (0 == strcmp (aname, EXR_REQ_NAME_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_NAME_STR,
                    type,
                    0,
                    NULL,
                    &(part->name));
                attr = part->name;
            }
            break;
        case 'p':
            if (0 == strcmp (aname, EXR_REQ_PAR_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_PAR_STR,
                    type,
                    0,
                    NULL,
                    &(part->pixelAspectRatio));
                attr = part->pixelAspectRatio;
            }
            break;
        case 's':
            if (0 == strcmp (aname, EXR_REQ_SCR_WC_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_SCR_WC_STR,
                    type,
                    0,
                    NULL,
                    &(part->screenWindowCenter));
                attr = part->screenWindowCenter;
            }
            else if (0 == strcmp (aname, EXR_REQ_SCR_WW_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_SCR_WW_STR,
                    type,
                    0,
                    NULL,
                    &(part->screenWindowWidth));
                attr = part->screenWindowWidth;
            }
            break;
        case 't':
            if (0 == strcmp (aname, EXR_REQ_TILES_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_TILES_STR,
                    type,
                    0,
                    NULL,
                    &(part->tiles));
                attr          = part->tiles;
                *update_tiles = 1;
            }
            else if (0 == strcmp (aname, EXR_REQ_TYPE_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_TYPE_STR,
                    type,
                    0,
                    NULL,
                    &(part->type));
                attr = part->type;
            }
            break;
        case 'v':
            if (0 == strcmp (aname, EXR_REQ_VERSION_STR))
            {
                rv = exr_attr_list_add_static_name (
                    ctxt,
                    &(part->attributes),
                    EXR_REQ_VERSION_STR,
                    type,
                    0,
                    NULL,
                    &(part->version));
                attr = part->version;
            }
            break;
        default: break;
    }

    if (rv == EXR_ERR_UNKNOWN && !attr)
    {
        rv = exr_attr_list_add (
            ctxt, &(part->attributes), aname, type, 0, NULL, &(attr));
    }

    if (rv != EXR_ERR_SUCCESS) return rv;

    switch (type)
    {
        case EXR_ATTR_BOX2I: *(attr->box2i) = *(srca->box2i); break;
        case EXR_ATTR_BOX2F: *(attr->box2f) = *(srca->box2f); break;
        case EXR_ATTR_CHLIST:
            rv = exr_attr_chlist_duplicate (ctxt, attr->chlist, srca->chlist);
            break;
        case EXR_ATTR_CHROMATICITIES:
            *(attr->chromaticities) = *(srca->chromaticities);
            break;
        case EXR_ATTR_COMPRESSION: attr->uc = srca->uc; break;
        case EXR_ATTR_DOUBLE: attr->d = srca->d; break;
        case EXR_ATTR_ENVMAP: attr->uc = srca->uc; break;
        case EXR_ATTR_FLOAT: attr->f = srca->f; break;
        case EXR_ATTR_FLOAT_VECTOR:
            rv = exr_attr_float_vector_create (
                ctxt,
                attr->floatvector,
                srca->floatvector->arr,
                srca->floatvector->length);
            break;
        case EXR_ATTR_INT: attr->i = srca->i; break;
        case EXR_ATTR_KEYCODE: *(attr->keycode) = *(srca->keycode); break;
        case EXR_ATTR_LINEORDER: attr->uc = srca->uc; break;
        case EXR_ATTR_M33F: *(attr->m33f) = *(srca->m33f); break;
        case EXR_ATTR_M33D: *(attr->m33d) = *(srca->m33d); break;
        case EXR_ATTR_M44F: *(attr->m44f) = *(srca->m44f); break;
        case EXR_ATTR_M44D: *(attr->m44d) = *(srca->m44d); break;
        case EXR_ATTR_PREVIEW:
            rv = exr_attr_preview_create (
                ctxt,
                attr->preview,
                srca->preview->width,
                srca->preview->height,
                srca->preview->rgba);
            break;
        case EXR_ATTR_RATIONAL: *(attr->rational) = *(srca->rational); break;
        case EXR_ATTR_STRING:
            rv = exr_attr_string_create_with_length (
                ctxt, attr->string, srca->string->str, srca->string->length);
            break;
        case EXR_ATTR_STRING_VECTOR:
            rv = exr_attr_string_vector_copy (
                ctxt, attr->stringvector, srca->stringvector);
            break;
        case EXR_ATTR_TILEDESC: *(attr->tiledesc) = *(srca->tiledesc); break;
        case EXR_ATTR_TIMECODE: *(attr->timecode) = *(srca->timecode); break;
        case EXR_ATTR_V2I: *(attr->v2i) = *(srca->v2i); break;
        case EXR_ATTR_V2F: *(attr->v2f) = *(srca->v2f); break;
        case EXR_ATTR_V2D: *(attr->v2d) = *(srca->v2d); break;
        case EXR_ATTR_V3I: *(attr->v3i) = *(srca->v3i); break;
        case EXR_ATTR_V3F: *(attr->v3f) = *(srca->v3f); break;
        case EXR_ATTR_V3D: *(attr->v3d) = *(srca->v3d); break;
        case EXR_ATTR_OPAQUE:
            rv = exr_attr_opaquedata_copy (ctxt, attr->opaque, srca->opaque);
            break;
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: rv = ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR); break;
    }

    if (rv != EXR_ERR_SUCCESS)
        exr_attr_list_remove (ctxt, &(part->attributes), attr);

    return rv;
}